

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
nivalis::diff_ast(vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  *__return_storage_ptr__,AST *ast,uint64_t var_addr,Environment *env)

{
  pointer pAVar1;
  bool bVar2;
  ASTNode local_188;
  Differentiator diff;
  
  (__return_storage_ptr__->
  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  anon_unknown_3::Differentiator::Differentiator(&diff,ast,var_addr,env,__return_storage_ptr__);
  bVar2 = anon_unknown_3::Differentiator::diff(&diff,(ASTNode **)0x0,0xffffffff);
  if (!bVar2) {
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::resize
              (__return_storage_ptr__,1);
    Expr::ASTNode::ASTNode(&local_188,null);
    pAVar1 = (__return_storage_ptr__->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pAVar1->opcode = local_188.opcode;
    *(undefined4 *)&pAVar1->field_0x4 = local_188._4_4_;
    pAVar1->field_1 = local_188.field_1;
  }
  anon_unknown_3::Differentiator::~Differentiator(&diff);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expr::ASTNode> diff_ast(const Expr::AST& ast,
        uint64_t var_addr, Environment& env) {
    std::vector<Expr::ASTNode> dast;
    Differentiator diff(ast, var_addr, env, dast);
    if (!diff.diff()) {
        dast.resize(1);
        dast[0] = OpCode::null;
    }
    return dast;
}